

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O2

Result __thiscall
wabt::FileStream::MoveDataImpl(FileStream *this,size_t dst_offset,size_t src_offset,size_t size)

{
  if (this->file_ != (FILE *)0x0) {
    if (size == 0) {
      return (Result)Ok;
    }
    fprintf(_stderr,"%s:%d: FileStream::MoveDataImpl not implemented!\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/stream.cc"
            ,0x133);
  }
  return (Result)Error;
}

Assistant:

Result FileStream::MoveDataImpl(size_t dst_offset,
                                size_t src_offset,
                                size_t size) {
  if (!file_) {
    return Result::Error;
  }
  if (size == 0) {
    return Result::Ok;
  }
  // TODO(binji): implement if needed.
  ERROR0("FileStream::MoveDataImpl not implemented!\n");
  return Result::Error;
}